

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall cppcms::json::variant::destroy(variant *this)

{
  json_type jVar1;
  
  jVar1 = this->type;
  if (jVar1 == is_array) {
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::~vector
              ((vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)this);
  }
  else if (jVar1 == is_object) {
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::~_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                 *)this);
  }
  else if ((jVar1 == is_string) && ((this->m).p != (void *)((long)&this->m + 0x10))) {
    operator_delete((this->m).p);
  }
  *(undefined8 *)((long)&this->m + 0x20) = 0;
  *(undefined8 *)((long)&this->m + 0x28) = 0;
  *(undefined8 *)((long)&this->m + 0x10) = 0;
  *(undefined8 *)((long)&this->m + 0x18) = 0;
  (this->m).p = (void *)0x0;
  *(undefined8 *)((long)&this->m + 8) = 0;
  return;
}

Assistant:

void destroy()
		{
			typedef std::string string_type;
			switch(type) {
			case is_undefined:
			case is_null:
			case is_boolean:
			case is_number:
				break;
			case is_string:
				static_cast<string_type *>(ptr())->~string_type();
				break;
			case is_object:
				static_cast<object *>(ptr())->~object();
				break;
			case is_array:
				static_cast<array *>(ptr())->~array();
				break;
			}
			memset(&m,0,sizeof(m));
		}